

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab_r::compute_cdf(tab_r *this)

{
  reference pvVar1;
  float_t fVar2;
  float_t fVar3;
  float_t fVar4;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Da;
  float fVar7;
  double dVar8;
  double dVar9;
  vec2 local_cc;
  vec2 local_c4;
  vec2 local_bc;
  float local_b4;
  value_type vStack_b0;
  float_t tmp;
  vec2 nint2;
  undefined1 local_a0 [4];
  float_t dp;
  vec3 wm;
  float_t spm;
  float_t cpm;
  float_t pm;
  float_t u1;
  int i1_1;
  double nint;
  float_t ndf;
  float_t stm;
  float_t ctm;
  float_t tm;
  float_t u2;
  int i2;
  int local_58;
  undefined1 local_54 [4];
  int i1;
  vec3 wi;
  float_t z_i;
  float_t zi;
  float_t ti;
  float_t u;
  int i3;
  double du1;
  double du2;
  int nu1;
  int nu2;
  int nti;
  tab_r *this_local;
  
  fVar2 = m_pi();
  fVar3 = m_pi();
  for (ti = 0.0; (int)ti < 0x10; ti = (float_t)((int)ti + 1)) {
    dVar8 = std::sqrt((double)(ulong)(uint)((float)(int)ti / 15.0));
    fVar4 = m_pi();
    fVar5 = (SUB84(dVar8,0) * fVar4) / 2.0;
    dVar8 = std::cos((double)(ulong)(uint)fVar5);
    wi.z = SUB84(dVar8,0);
    fVar6 = sat<float>(&wi.z);
    dVar8 = std::sin((double)(ulong)(uint)fVar5);
    wi.y = SUB84(dVar8,0);
    vec3::vec3((vec3 *)local_54,wi.y,0.0,fVar6);
    for (local_58 = 0; local_58 < 0x40; local_58 = local_58 + 1) {
      vec2::vec2((vec2 *)&u2,0.0);
      std::vector<djb::vec2,_std::allocator<djb::vec2>_>::push_back(&this->m_cdf,(value_type *)&u2);
    }
    for (tm = 1.4013e-45; (int)tm < 0x100; tm = (float_t)((int)tm + 1)) {
      ctm = (float)(int)tm / 256.0;
      fVar5 = sqr<float>(&ctm);
      fVar4 = m_pi();
      fVar5 = (fVar5 * fVar4) / 2.0;
      dVar8 = std::cos((double)(ulong)(uint)fVar5);
      dVar9 = std::sin((double)(ulong)(uint)fVar5);
      fVar6 = SUB84(dVar9,0);
      (*(this->super_radial).super_microfacet.super_brdf._vptr_brdf[0xe])((ulong)dVar8 & 0xffffffff)
      ;
      fVar5 = 0.0;
      for (pm = 0.0; (int)pm < 0x40; pm = (float_t)((int)pm + 1)) {
        fVar4 = m_pi();
        fVar7 = ((float)(int)pm / 64.0 + (float)(int)pm / 64.0 + -1.0) * fVar4;
        dVar9 = std::cos((double)(ulong)(uint)fVar7);
        wm.z = SUB84(dVar9,0);
        dVar9 = std::sin((double)(ulong)(uint)fVar7);
        wm.y = SUB84(dVar9,0);
        vec3::vec3((vec3 *)local_a0,fVar6 * wm.z,fVar6 * wm.y,SUB84(dVar8,0));
        nint2.x = dot((vec3 *)local_a0,(vec3 *)local_54);
        nint2.y = sat<float>(&nint2.x);
        pvVar1 = std::vector<djb::vec2,_std::allocator<djb::vec2>_>::operator[]
                           (&this->m_cdf,(long)((int)pm + ((int)tm + -1 + (int)ti * 0x100) * 0x40));
        vStack_b0 = *pvVar1;
        local_b4 = nint2.y * extraout_XMM0_Da * ctm * fVar6;
        fVar5 = fVar5 + local_b4;
        vec2::vec2(&local_cc,fVar5 * ((fVar3 * 2.0) / 256.0),local_b4);
        local_c4 = djb::operator*(&local_cc,fVar2 / 64.0);
        local_bc = djb::operator+(&local_c4,&stack0xffffffffffffff50);
        std::vector<djb::vec2,_std::allocator<djb::vec2>_>::push_back(&this->m_cdf,&local_bc);
      }
    }
  }
  fprintf(_stdout,"djb_verbose: CDF ready\n");
  return;
}

Assistant:

void tab_r::compute_cdf()
{
	int nti = 16;
	int nu2 = 256;
	int nu1 = 64;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i3 = 0; i3 < nti; ++i3) {
		float_t u = (float_t)i3 / (nti - 1); // in [0,1]
		float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
		float_t zi = sat(cos(ti)), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		// bottom row (zeroes)
		for (int i1 = 0; i1 < nu1; ++i1)
			m_cdf.push_back(vec2(0));

		// rest of the domain
		for (int i2 = 1; i2 < nu2; ++i2) {
			float_t u2 = (float_t)i2 / nu2;   // in (0,1)
			float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
			float_t ctm = cos(tm), stm = sin(tm);
			float_t ndf = ndf_std_radial(ctm);
			double nint = 0;

			for (int i1 = 0; i1 < nu1; ++i1) {
				float_t u1 = (float_t)i1 / nu1;    // in [0,1)
				float_t pm = (2 * u1 - 1) * m_pi();  // in [-pi,pi)
				float_t cpm = cos(pm), spm = sin(pm);
				vec3 wm = vec3(stm * cpm, stm * spm, ctm);
				float_t dp = sat(dot(wm, wi));
				vec2 nint2 = m_cdf[i1 + nu1 * (i2 - 1 + nu2 * i3)];
				float_t tmp = dp * ndf * u2 * stm;

				nint+= (double)tmp;
				m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}